

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int encode(uint8_t *in,uint64_t *out,size_t l,uint64_t q)

{
  ulong local_68;
  size_t bi;
  uint8_t byte;
  size_t by;
  size_t num_bytes;
  uint64_t high;
  uint64_t low;
  uint64_t q_local;
  size_t l_local;
  uint64_t *out_local;
  uint8_t *in_local;
  int local_4;
  
  if ((in == (uint8_t *)0x0) || (out == (uint64_t *)0x0)) {
    local_4 = -1;
  }
  else {
    num_bytes = l >> 3;
    if (num_bytes << 3 != l) {
      num_bytes = num_bytes + 1;
    }
    l_local = l;
    for (by = 0; by < num_bytes; by = by + 1) {
      byte = in[by];
      for (bi = 0; bi < 8 && l_local != 0; bi = bi + 1) {
        local_68 = q >> 1;
        if ((byte & 0x80) == 0) {
          local_68 = 0;
        }
        out[by * 8 + bi] = local_68;
        byte = byte << 1;
        l_local = l_local - 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int encode(uint8_t in[], uint64_t out[], size_t l, uint64_t q) {
    if(in == NULL || out == NULL)
        return -1;

    // define possible encoding values
    uint64_t low = 0;
    uint64_t high = q/2;

    // calculate number of bytes
    size_t num_bytes = l/8;
    if(num_bytes * 8 != l)
        num_bytes++;

    // iterate over bytes and bits and encode input
    for(size_t by = 0; by < num_bytes; by++) {
        uint8_t byte = in[by];
        for(size_t bi = 0; bi < 8 && l > 0; bi++) {
            out[by*8+bi] = (byte & 0x80) ? high : low;
            byte <<= 1;
            l--;
        }
    }

    return 0;
}